

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_4::EmptyIterator::EmptyIterator(EmptyIterator *this,Status *s)

{
  Status *s_local;
  EmptyIterator *this_local;
  
  Iterator::Iterator(&this->super_Iterator);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__EmptyIterator_00166440;
  Status::Status(&this->status_,s);
  return;
}

Assistant:

EmptyIterator(const Status& s) : status_(s) {}